

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_> * __thiscall
GLRParser::findParseOptions
          (set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
           *__return_storage_ptr__,GLRParser *this,string *inputChar,GLRState *currentState)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  int iVar5;
  ParseOperation *pPVar6;
  Production *this_00;
  string *psVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  ParseOperation *local_38;
  
  p_Var9 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var9->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var9->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  startStateName_abi_cxx11_();
  sVar2 = (currentState->name)._M_string_length;
  if (sVar2 == local_90._M_string_length) {
    if (sVar2 != 0) {
      iVar5 = bcmp((currentState->name)._M_dataplus._M_p,local_90._M_dataplus._M_p,sVar2);
      if (iVar5 != 0) goto LAB_00134402;
    }
    sVar2 = inputChar->_M_string_length;
    if (sVar2 == (this->startState->name)._M_string_length) {
      if (sVar2 == 0) {
        bVar10 = true;
      }
      else {
        iVar5 = bcmp((inputChar->_M_dataplus)._M_p,(this->startState->name)._M_dataplus._M_p,sVar2);
        bVar10 = iVar5 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (!bVar10) goto LAB_00134576;
    pPVar6 = (ParseOperation *)operator_new(0x18);
    this_00 = (Production *)operator_new(0x38);
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"accept","");
    startStateName_abi_cxx11_();
    __l._M_len = 1;
    __l._M_array = &local_70;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,__l,&local_91);
    Production::Production(this_00,&local_90,&local_50);
    pPVar6->reduceProduction = this_00;
    pPVar6->newState = (GLRState *)0x0;
    psVar7 = Production::getFromP_abi_cxx11_(this_00);
    iVar5 = std::__cxx11::string::compare((char *)psVar7);
    pPVar6->operationType = (iVar5 == 0) + reduce;
    local_38 = pPVar6;
    std::
    _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
    ::_M_insert_unique<ParseOperation*>
              ((_Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
                *)__return_storage_ptr__,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) goto LAB_00134576;
  }
  else {
LAB_00134402:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00134576;
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
LAB_00134576:
  p_Var8 = (currentState->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(currentState->statesTo)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var9) {
    do {
      puVar3 = *(undefined8 **)(p_Var8 + 1);
      sVar2 = puVar3[1];
      if (sVar2 == inputChar->_M_string_length) {
        if (sVar2 != 0) {
          iVar5 = bcmp((void *)*puVar3,(inputChar->_M_dataplus)._M_p,sVar2);
          if (iVar5 != 0) goto LAB_001345e2;
        }
        local_90._M_dataplus._M_p = (pointer)operator_new(0x18);
        uVar4 = puVar3[4];
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 8) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 9) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 10) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 0xb) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 0xc) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 0xd) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 0xe) = '\0';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p + 0xf) = '\0';
        *(undefined8 *)(local_90._M_dataplus._M_p + 0x10) = uVar4;
        *(undefined4 *)local_90._M_dataplus._M_p = 1;
        std::
        _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
        ::_M_insert_unique<ParseOperation*>
                  ((_Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
                    *)__return_storage_ptr__,(ParseOperation **)&local_90);
      }
LAB_001345e2:
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var9);
  }
  return __return_storage_ptr__;
}

Assistant:

set<ParseOperation *>
GLRParser::findParseOptions(const std::string &inputChar, const GLRState *currentState) const {

    set<ParseOperation *> parseOperations;

    if (currentState->getName() == startStateName() && inputChar == startState->getName()) {
        parseOperations.insert(new ParseOperation(new Production("accept", {startStateName()})));
    }

    for (auto stateTo: currentState->getStatesTo()) {
        if (stateTo->getLabel() == inputChar) {
            parseOperations.insert(new ParseOperation(stateTo->getStateTo()));

//            if (stateTo->getStateTo()->isAccepting()) {
//                for (auto prod: stateTo->getStateTo()->getProductions()) {
//                    if (prod->getToP()[prod->getToP().size() - 1] == getMarker()) {
//                        parseOperations.insert(new ParseOperation(prod));
//                    }
//                }
//            }

        }
    }
    return parseOperations;
}